

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void llvm::APInt::tcExtract(WordType *dst,uint dstCount,WordType *src,uint srcBits,uint srcLSB)

{
  uint uVar1;
  WordType WVar2;
  WordType mask;
  uint n;
  uint shift;
  uint firstSrcPart;
  uint dstParts;
  uint srcLSB_local;
  uint srcBits_local;
  WordType *src_local;
  uint dstCount_local;
  WordType *dst_local;
  
  shift = srcBits + 0x3f >> 6;
  if (dstCount < shift) {
    __assert_fail("dstParts <= dstCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x8dd,
                  "static void llvm::APInt::tcExtract(WordType *, unsigned int, const WordType *, unsigned int, unsigned int)"
                 );
  }
  tcAssign(dst,src + (srcLSB >> 6),shift);
  tcShiftRight(dst,shift,srcLSB & 0x3f);
  uVar1 = shift * 0x40 - (srcLSB & 0x3f);
  if (uVar1 < srcBits) {
    WVar2 = lowBitMask(srcBits - uVar1);
    dst[shift - 1] = (src[(srcLSB >> 6) + shift] & WVar2) << ((byte)uVar1 & 0x3f) | dst[shift - 1];
  }
  else if ((srcBits < uVar1) && ((srcBits & 0x3f) != 0)) {
    WVar2 = lowBitMask(srcBits & 0x3f);
    dst[shift - 1] = WVar2 & dst[shift - 1];
  }
  while (shift < dstCount) {
    dst[shift] = 0;
    shift = shift + 1;
  }
  return;
}

Assistant:

void
APInt::tcExtract(WordType *dst, unsigned dstCount, const WordType *src,
                 unsigned srcBits, unsigned srcLSB) {
  unsigned dstParts = (srcBits + APINT_BITS_PER_WORD - 1) / APINT_BITS_PER_WORD;
  assert(dstParts <= dstCount);

  unsigned firstSrcPart = srcLSB / APINT_BITS_PER_WORD;
  tcAssign (dst, src + firstSrcPart, dstParts);

  unsigned shift = srcLSB % APINT_BITS_PER_WORD;
  tcShiftRight (dst, dstParts, shift);

  /* We now have (dstParts * APINT_BITS_PER_WORD - shift) bits from SRC
     in DST.  If this is less that srcBits, append the rest, else
     clear the high bits.  */
  unsigned n = dstParts * APINT_BITS_PER_WORD - shift;
  if (n < srcBits) {
    WordType mask = lowBitMask (srcBits - n);
    dst[dstParts - 1] |= ((src[firstSrcPart + dstParts] & mask)
                          << n % APINT_BITS_PER_WORD);
  } else if (n > srcBits) {
    if (srcBits % APINT_BITS_PER_WORD)
      dst[dstParts - 1] &= lowBitMask (srcBits % APINT_BITS_PER_WORD);
  }

  /* Clear high parts.  */
  while (dstParts < dstCount)
    dst[dstParts++] = 0;
}